

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

Ptr * __thiscall
wabt::interp::Instance::Instantiate
          (Ptr *__return_storage_ptr__,Instance *this,Store *store,Ref module,RefVec *imports,
          Ptr *out_trap)

{
  pointer pIVar1;
  FuncDesc *pFVar2;
  pointer pTVar3;
  pointer pMVar4;
  pointer pGVar5;
  EventType *pEVar6;
  pointer pEVar7;
  pointer pEVar8;
  pointer pDVar9;
  ElemSegment *pEVar10;
  ElemDesc *pEVar11;
  DataSegment *pDVar12;
  DataDesc *pDVar13;
  pointer pSVar14;
  undefined8 uVar15;
  int iVar16;
  Result RVar17;
  ulong uVar18;
  long lVar19;
  Ref instance;
  ulong uVar20;
  pointer pRVar21;
  pointer pRVar22;
  FuncDesc *desc;
  FuncDesc *pFVar23;
  EventType *pEVar24;
  uint uVar25;
  GlobalDesc *desc_3;
  ulong uVar26;
  pointer pGVar27;
  Instance *store_00;
  RefVec *pRVar28;
  pointer pSVar29;
  ExportDesc *desc_5;
  long lVar30;
  pointer pEVar31;
  pointer pDVar32;
  ElemSegment *src;
  DataSegment *src_00;
  TableDesc *desc_1;
  pointer pTVar33;
  pointer pMVar34;
  pointer pEVar35;
  Value VVar36;
  Value value;
  Ptr inst;
  Ptr table;
  Ptr extern_;
  Ptr mod;
  Ref extern_ref;
  Ptr local_148;
  long *local_130;
  undefined **local_128;
  ExternKind local_120;
  undefined8 local_11c;
  Ref module_local;
  undefined1 local_108 [40];
  TableType local_e0;
  EventType local_b8;
  FuncDesc local_90;
  
  module_local.index = (size_t)store;
  RefPtr<wabt::interp::Module>::RefPtr(&mod,(Store *)this,(Ref)store);
  Store::Alloc<wabt::interp::Instance,wabt::interp::Store&,wabt::interp::Ref&>
            (&inst,(Store *)this,(Store *)this,&module_local);
  uVar18 = ((long)((mod.obj_)->desc_).imports.
                  super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)((mod.obj_)->desc_).imports.
                 super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x48;
  local_130 = (long *)module.index;
  if ((ulong)(*(long *)(module.index + 8) - *(long *)module.index >> 3) < uVar18) {
    std::__cxx11::string::string((string *)&extern_,"not enough imports!",(allocator *)&extern_ref);
    local_148.obj_ = (Trap *)0x0;
    local_148.store_ = (Store *)0x0;
    local_148.root_index_ = 0;
    Trap::New((Ptr *)&table,(Store *)this,(string *)&extern_,
              (vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)&local_148);
    (imports->super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)table.obj_;
    (imports->super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)table.store_;
    (imports->super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)table.root_index_;
    table.obj_ = (Table *)0x0;
    table.store_ = (Store *)0x0;
    table.root_index_ = 0;
    RefPtr<wabt::interp::Trap>::reset((RefPtr<wabt::interp::Trap> *)&table);
    std::_Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::~_Vector_base
              ((_Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)&local_148
              );
    std::__cxx11::string::_M_dispose();
    __return_storage_ptr__->obj_ = (Instance *)0x0;
    __return_storage_ptr__->store_ = (Store *)0x0;
    __return_storage_ptr__->root_index_ = 0;
  }
  else {
    lVar30 = 0;
    uVar26 = 0;
    while (uVar18 != uVar26) {
      pIVar1 = ((mod.obj_)->desc_).imports.
               super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
               ._M_impl.super__Vector_impl_data._M_start;
      extern_ref.index = *(size_t *)(*local_130 + uVar26 * 8);
      if (extern_ref.index == 0) {
        StringPrintf_abi_cxx11_
                  ((string *)&extern_,"invalid import \"%s.%s\"",
                   *(undefined8 *)((long)&(pIVar1->type).module._M_dataplus._M_p + lVar30),
                   *(undefined8 *)((long)&(pIVar1->type).name._M_dataplus._M_p + lVar30));
        local_148.obj_ = (Trap *)0x0;
        local_148.store_ = (Store *)0x0;
        local_148.root_index_ = 0;
        Trap::New((Ptr *)&table,(Store *)this,(string *)&extern_,
                  (vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)&local_148);
        (imports->super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>)._M_impl
        .super__Vector_impl_data._M_start = (pointer)table.obj_;
        (imports->super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>)._M_impl
        .super__Vector_impl_data._M_finish = (pointer)table.store_;
        (imports->super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>)._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)table.root_index_;
        table.obj_ = (Table *)0x0;
        table.store_ = (Store *)0x0;
        table.root_index_ = 0;
        RefPtr<wabt::interp::Trap>::reset((RefPtr<wabt::interp::Trap> *)&table);
        std::_Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::~_Vector_base
                  ((_Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                   &local_148);
        std::__cxx11::string::_M_dispose();
        __return_storage_ptr__->obj_ = (Instance *)0x0;
        __return_storage_ptr__->store_ = (Store *)0x0;
        __return_storage_ptr__->root_index_ = 0;
        goto LAB_0015ee52;
      }
      RefPtr<wabt::interp::Extern>::RefPtr(&extern_,(Store *)this,extern_ref);
      iVar16 = (*((extern_.obj_)->super_Object)._vptr_Object[3])
                         (extern_.obj_,this,(long)&(pIVar1->type).module._M_dataplus._M_p + lVar30,
                          imports);
      if (iVar16 == 1) {
        __return_storage_ptr__->obj_ = (Instance *)0x0;
        __return_storage_ptr__->store_ = (Store *)0x0;
        __return_storage_ptr__->root_index_ = 0;
        goto switchD_0015e5d7_default;
      }
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                (&(inst.obj_)->imports_,&extern_ref);
      switch(*(undefined4 *)
              (*(long *)((long)&(pIVar1->type).type._M_t.
                                super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
                                .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>.
                                _M_head_impl + lVar30) + 8)) {
      case 0:
        pRVar28 = &(inst.obj_)->funcs_;
        goto LAB_0015e614;
      case 1:
        pRVar28 = &(inst.obj_)->tables_;
        goto LAB_0015e614;
      case 2:
        lVar19 = 0x90;
        break;
      case 3:
        lVar19 = 0xa8;
        break;
      case 4:
        lVar19 = 0xc0;
        break;
      default:
        goto switchD_0015e5d7_default;
      }
      pRVar28 = (RefVec *)((long)&((inst.obj_)->super_Object)._vptr_Object + lVar19);
LAB_0015e614:
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                (pRVar28,&extern_ref);
switchD_0015e5d7_default:
      RefPtr<wabt::interp::Extern>::reset(&extern_);
      uVar26 = uVar26 + 1;
      lVar30 = lVar30 + 0x48;
      if (iVar16 == 1) goto LAB_0015ee52;
    }
    pFVar2 = ((mod.obj_)->desc_).funcs.
             super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pFVar23 = ((mod.obj_)->desc_).funcs.
                   super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pFVar23 != pFVar2;
        pFVar23 = pFVar23 + 1) {
      pRVar28 = &(inst.obj_)->funcs_;
      instance = RefPtr<wabt::interp::Instance>::ref(&inst);
      FuncDesc::FuncDesc(&local_90,pFVar23);
      DefinedFunc::New((Ptr *)&extern_,(Store *)this,instance,&local_90);
      table.obj_ = (Table *)RefPtr<wabt::interp::DefinedFunc>::ref((Ptr *)&extern_);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
      emplace_back<wabt::interp::Ref>(pRVar28,(Ref *)&table);
      RefPtr<wabt::interp::DefinedFunc>::reset((Ptr *)&extern_);
      FuncDesc::~FuncDesc(&local_90);
    }
    pTVar3 = ((mod.obj_)->desc_).tables.
             super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pTVar33 = ((mod.obj_)->desc_).tables.
                   super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pTVar33 != pTVar3;
        pTVar33 = pTVar33 + 1) {
      pRVar28 = &(inst.obj_)->tables_;
      local_e0.super_ExternType.kind = (pTVar33->type).super_ExternType.kind;
      local_e0.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_001b2210;
      local_e0.limits._12_6_ =
           SUB86((ulong)*(undefined8 *)((long)&(pTVar33->type).limits.max + 2) >> 0x10,0);
      local_e0._12_8_ = *(undefined8 *)&(pTVar33->type).super_ExternType.field_0xc;
      uVar15 = *(undefined8 *)((long)&(pTVar33->type).limits.initial + 4);
      local_e0.limits._4_6_ = SUB86(uVar15,0);
      local_e0.limits.max._2_2_ = (undefined2)((ulong)uVar15 >> 0x30);
      Table::New((Ptr *)&extern_,(Store *)this,&local_e0);
      table.obj_ = (Table *)RefPtr<wabt::interp::Table>::ref((Ptr *)&extern_);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
      emplace_back<wabt::interp::Ref>(pRVar28,(Ref *)&table);
      RefPtr<wabt::interp::Table>::reset((Ptr *)&extern_);
    }
    pMVar4 = ((mod.obj_)->desc_).memories.
             super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pMVar34 = ((mod.obj_)->desc_).memories.
                   super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pMVar34 != pMVar4;
        pMVar34 = pMVar34 + 1) {
      pRVar28 = &(inst.obj_)->memories_;
      local_108._8_4_ = (pMVar34->type).super_ExternType.kind;
      local_108._0_8_ = &PTR__ExternType_001b2250;
      local_108._32_8_ = *(undefined8 *)&(pMVar34->type).limits.has_max;
      local_108._16_8_ = (pMVar34->type).limits.initial;
      local_108._24_8_ = (pMVar34->type).limits.max;
      Memory::New((Ptr *)&extern_,(Store *)this,(MemoryType *)local_108);
      table.obj_ = (Table *)RefPtr<wabt::interp::Memory>::ref((Ptr *)&extern_);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
      emplace_back<wabt::interp::Ref>(pRVar28,(Ref *)&table);
      RefPtr<wabt::interp::Memory>::reset((Ptr *)&extern_);
    }
    pGVar5 = ((mod.obj_)->desc_).globals.
             super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pGVar27 = ((mod.obj_)->desc_).globals.
                   super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pGVar27 != pGVar5;
        pGVar27 = pGVar27 + 1) {
      pRVar28 = &(inst.obj_)->globals_;
      local_120 = (pGVar27->type).super_ExternType.kind;
      local_128 = &PTR__ExternType_001b2290;
      local_11c = *(undefined8 *)&(pGVar27->type).super_ExternType.field_0xc;
      VVar36 = ResolveInitExpr(inst.obj_,(Store *)this,pGVar27->init);
      value._8_8_ = out_trap;
      value.i64_ = VVar36._8_8_;
      Global::New((Ptr *)&extern_,(Global *)this,(Store *)&local_128,(GlobalType *)VVar36.i64_,value
                 );
      table.obj_ = (Table *)RefPtr<wabt::interp::Global>::ref((Ptr *)&extern_);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
      emplace_back<wabt::interp::Ref>(pRVar28,(Ref *)&table);
      RefPtr<wabt::interp::Global>::reset((Ptr *)&extern_);
    }
    pEVar6 = &(((mod.obj_)->desc_).events.
               super__Vector_base<wabt::interp::EventDesc,_std::allocator<wabt::interp::EventDesc>_>
               ._M_impl.super__Vector_impl_data._M_finish)->type;
    for (pEVar24 = &(((mod.obj_)->desc_).events.
                     super__Vector_base<wabt::interp::EventDesc,_std::allocator<wabt::interp::EventDesc>_>
                     ._M_impl.super__Vector_impl_data._M_start)->type; pEVar24 != pEVar6;
        pEVar24 = pEVar24 + 1) {
      pRVar28 = &(inst.obj_)->events_;
      EventType::EventType(&local_b8,pEVar24);
      Event::New((Ptr *)&extern_,(Store *)this,&local_b8);
      table.obj_ = (Table *)RefPtr<wabt::interp::Event>::ref((Ptr *)&extern_);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
      emplace_back<wabt::interp::Ref>(pRVar28,(Ref *)&table);
      RefPtr<wabt::interp::Event>::reset((Ptr *)&extern_);
      EventType::~EventType(&local_b8);
    }
    pEVar7 = ((mod.obj_)->desc_).exports.
             super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pEVar31 = ((mod.obj_)->desc_).exports.
                   super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pEVar31 != pEVar7;
        pEVar31 = pEVar31 + 1) {
      switch(((pEVar31->type).type._M_t.
              super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
              ._M_t.
              super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
              .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl)->kind) {
      case First:
        uVar18 = (ulong)pEVar31->index;
        pRVar21 = ((inst.obj_)->funcs_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start;
        break;
      case Table:
        uVar18 = (ulong)pEVar31->index;
        pRVar21 = ((inst.obj_)->tables_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start;
        break;
      case Memory:
        uVar18 = (ulong)pEVar31->index;
        pRVar21 = ((inst.obj_)->memories_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start;
        break;
      case Global:
        uVar18 = (ulong)pEVar31->index;
        pRVar21 = ((inst.obj_)->globals_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start;
        break;
      case Event:
        uVar18 = (ulong)pEVar31->index;
        pRVar21 = ((inst.obj_)->events_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start;
        break;
      default:
        goto switchD_0015e97b_default;
      }
      extern_.obj_ = (Extern *)pRVar21[uVar18].index;
switchD_0015e97b_default:
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                (&(inst.obj_)->exports_,(value_type *)&extern_);
    }
    pEVar8 = ((mod.obj_)->desc_).elems.
             super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pEVar35 = ((mod.obj_)->desc_).elems.
                   super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pEVar35 != pEVar8;
        pEVar35 = pEVar35 + 1) {
      extern_.obj_ = (Extern *)pEVar35;
      std::vector<wabt::interp::ElemSegment,std::allocator<wabt::interp::ElemSegment>>::
      emplace_back<wabt::interp::ElemDesc_const*,wabt::interp::RefPtr<wabt::interp::Instance>&>
                ((vector<wabt::interp::ElemSegment,std::allocator<wabt::interp::ElemSegment>> *)
                 &(inst.obj_)->elems_,(ElemDesc **)&extern_,&inst);
    }
    pDVar9 = ((mod.obj_)->desc_).datas.
             super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pDVar32 = ((mod.obj_)->desc_).datas.
                   super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pDVar32 != pDVar9;
        pDVar32 = pDVar32 + 1) {
      extern_.obj_ = (Extern *)pDVar32;
      std::vector<wabt::interp::DataSegment,std::allocator<wabt::interp::DataSegment>>::
      emplace_back<wabt::interp::DataDesc_const*>
                ((vector<wabt::interp::DataSegment,std::allocator<wabt::interp::DataSegment>> *)
                 &(inst.obj_)->datas_,(DataDesc **)&extern_);
    }
    for (uVar25 = (uint)(byte)(char)(this->super_Object).kind_; uVar25 != 2; uVar25 = uVar25 + 1) {
      pEVar10 = ((inst.obj_)->elems_).
                super__Vector_base<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (src = ((inst.obj_)->elems_).
                 super__Vector_base<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>
                 ._M_impl.super__Vector_impl_data._M_start; src != pEVar10; src = src + 1) {
        pEVar11 = src->desc_;
        if (pEVar11->mode == Declared) {
          pRVar21 = (src->elements_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if ((src->elements_).
              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
              super__Vector_impl_data._M_finish != pRVar21) {
            (src->elements_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = pRVar21;
          }
        }
        else if (pEVar11->mode == Active) {
          RefPtr<wabt::interp::Table>::RefPtr
                    ((RefPtr<wabt::interp::Table> *)&table,(Store *)this,
                     (Ref)((inst.obj_)->tables_).
                          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                          _M_impl.super__Vector_impl_data._M_start[pEVar11->table_index].index);
          store_00 = this;
          VVar36 = ResolveInitExpr(inst.obj_,(Store *)this,pEVar11->offset);
          uVar18 = VVar36.i64_;
          pRVar21 = (src->elements_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pRVar22 = (src->elements_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          uVar26 = (ulong)((long)pRVar22 - (long)pRVar21) >> 3;
          if (uVar25 == 0) {
            uVar20 = (long)((table.obj_)->elements_).
                           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)((table.obj_)->elements_).
                           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3;
            uVar26 = uVar26 & 0xffffffff;
            RVar17.enum_ = (Enum)(uVar20 - uVar26 < (uVar18 & 0xffffffff) || uVar20 < uVar26);
          }
          else {
            RVar17 = Table::Init(table.obj_,(Store *)store_00,VVar36.i32_,src,0,(u32)uVar26);
            pRVar21 = (src->elements_).
                      super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pRVar22 = pRVar21;
            if ((src->elements_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_finish != pRVar21) {
              (src->elements_).
              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
              super__Vector_impl_data._M_finish = pRVar21;
            }
          }
          if (RVar17.enum_ == Error) {
            StringPrintf_abi_cxx11_
                      ((string *)&extern_,
                       "out of bounds table access: elem segment is out of bounds: [%u, %lu) >= max value %u"
                       ,uVar18 & 0xffffffff,
                       ((ulong)((long)pRVar22 - (long)pRVar21) >> 3 & 0xffffffff) +
                       (uVar18 & 0xffffffff),
                       (ulong)((long)((table.obj_)->elements_).
                                     super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)((table.obj_)->elements_).
                                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3);
            extern_ref.index = 0;
            Trap::New(&local_148,(Store *)this,(string *)&extern_,
                      (vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                      &extern_ref);
            (imports->super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>).
            _M_impl.super__Vector_impl_data._M_start = (pointer)local_148.obj_;
            (imports->super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>).
            _M_impl.super__Vector_impl_data._M_finish = (pointer)local_148.store_;
            (imports->super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_148.root_index_;
            local_148.obj_ = (Trap *)0x0;
            local_148.store_ = (Store *)0x0;
            local_148.root_index_ = 0;
            RefPtr<wabt::interp::Trap>::reset(&local_148);
            std::_Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::
            ~_Vector_base((_Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *
                          )&extern_ref);
            std::__cxx11::string::_M_dispose();
            __return_storage_ptr__->obj_ = (Instance *)0x0;
            __return_storage_ptr__->store_ = (Store *)0x0;
            __return_storage_ptr__->root_index_ = 0;
            RefPtr<wabt::interp::Table>::reset(&table);
            goto LAB_0015ee52;
          }
          RefPtr<wabt::interp::Table>::reset((RefPtr<wabt::interp::Table> *)&table);
        }
      }
      pDVar12 = ((inst.obj_)->datas_).
                super__Vector_base<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (src_00 = ((inst.obj_)->datas_).
                    super__Vector_base<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>
                    ._M_impl.super__Vector_impl_data._M_start; src_00 != pDVar12;
          src_00 = src_00 + 1) {
        pDVar13 = src_00->desc_;
        if (pDVar13->mode == Declared) {
          src_00->size_ = 0;
        }
        else if (pDVar13->mode == Active) {
          RefPtr<wabt::interp::Memory>::RefPtr
                    ((RefPtr<wabt::interp::Memory> *)&table,(Store *)this,
                     (Ref)((inst.obj_)->memories_).
                          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                          _M_impl.super__Vector_impl_data._M_start[pDVar13->memory_index].index);
          VVar36 = ResolveInitExpr(inst.obj_,(Store *)this,pDVar13->offset);
          uVar18 = VVar36.i64_;
          uVar26 = (ulong)src_00->size_;
          if (uVar25 == 0) {
            if ((uVar18 & 0xffffffff) + uVar26 <=
                (ulong)((long)((table.obj_)->elements_).
                              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)((table.obj_)->elements_).
                             super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                             ._M_impl.super__Vector_impl_data._M_start)) goto LAB_0015ec2a;
          }
          else {
            RVar17 = Memory::Init((Memory *)table.obj_,VVar36.i32_,src_00,0,src_00->size_);
            src_00->size_ = 0;
            if (RVar17.enum_ != Error) {
LAB_0015ec2a:
              RefPtr<wabt::interp::Memory>::reset((RefPtr<wabt::interp::Memory> *)&table);
              goto LAB_0015ec32;
            }
            uVar26 = 0;
          }
          StringPrintf_abi_cxx11_
                    ((string *)&extern_,
                     "out of bounds memory access: data segment is out of bounds: [%u, %lu) >= max value %u"
                     ,uVar18 & 0xffffffff,(uVar18 & 0xffffffff) + uVar26,
                     (ulong)(uint)(*(int *)&((table.obj_)->elements_).
                                            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                  *(int *)&((table.obj_)->elements_).
                                           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                           ._M_impl.super__Vector_impl_data._M_start));
          extern_ref.index = 0;
          Trap::New(&local_148,(Store *)this,(string *)&extern_,
                    (vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)&extern_ref
                   );
          (imports->super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>).
          _M_impl.super__Vector_impl_data._M_start = (pointer)local_148.obj_;
          (imports->super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>).
          _M_impl.super__Vector_impl_data._M_finish = (pointer)local_148.store_;
          (imports->super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_148.root_index_;
          local_148.obj_ = (Trap *)0x0;
          local_148.store_ = (Store *)0x0;
          local_148.root_index_ = 0;
          RefPtr<wabt::interp::Trap>::reset(&local_148);
          std::_Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::
          ~_Vector_base((_Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                        &extern_ref);
          std::__cxx11::string::_M_dispose();
          __return_storage_ptr__->obj_ = (Instance *)0x0;
          __return_storage_ptr__->store_ = (Store *)0x0;
          __return_storage_ptr__->root_index_ = 0;
          RefPtr<wabt::interp::Memory>::reset((RefPtr<wabt::interp::Memory> *)&table);
          goto LAB_0015ee52;
        }
LAB_0015ec32:
      }
    }
    pSVar29 = ((mod.obj_)->desc_).starts.
              super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pSVar14 = ((mod.obj_)->desc_).starts.
              super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    while( true ) {
      if (pSVar29 == pSVar14) {
        __return_storage_ptr__->obj_ = inst.obj_;
        __return_storage_ptr__->store_ = inst.store_;
        __return_storage_ptr__->root_index_ = inst.root_index_;
        inst.obj_ = (Instance *)0x0;
        inst.store_ = (Store *)0x0;
        inst.root_index_ = 0;
        goto LAB_0015ee52;
      }
      RefPtr<wabt::interp::Func>::RefPtr
                ((RefPtr<wabt::interp::Func> *)&extern_,(Store *)this,
                 (Ref)((inst.obj_)->funcs_).
                      super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                      _M_impl.super__Vector_impl_data._M_start[pSVar29->func_index].index);
      table.obj_ = (Table *)0x0;
      table.store_ = (Store *)0x0;
      table.root_index_ = 0;
      local_148.obj_ = (Trap *)0x0;
      local_148.store_ = (Store *)0x0;
      local_148.root_index_ = 0;
      RVar17 = Func::Call((Func *)extern_.obj_,(Store *)this,(Values *)&local_148,(Values *)&table,
                          (Ptr *)imports,(Stream *)0x0);
      std::_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~_Vector_base
                ((_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)
                 &local_148);
      if (RVar17.enum_ == Error) break;
      std::_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~_Vector_base
                ((_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)&table);
      RefPtr<wabt::interp::Func>::reset((RefPtr<wabt::interp::Func> *)&extern_);
      pSVar29 = pSVar29 + 1;
    }
    __return_storage_ptr__->obj_ = (Instance *)0x0;
    __return_storage_ptr__->store_ = (Store *)0x0;
    __return_storage_ptr__->root_index_ = 0;
    std::_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~_Vector_base
              ((_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)&table);
    RefPtr<wabt::interp::Func>::reset((RefPtr<wabt::interp::Func> *)&extern_);
  }
LAB_0015ee52:
  RefPtr<wabt::interp::Instance>::reset(&inst);
  RefPtr<wabt::interp::Module>::reset(&mod);
  return __return_storage_ptr__;
}

Assistant:

Instance::Ptr Instance::Instantiate(Store& store,
                                    Ref module,
                                    const RefVec& imports,
                                    Trap::Ptr* out_trap) {
  Module::Ptr mod{store, module};
  Instance::Ptr inst = store.Alloc<Instance>(store, module);

  size_t import_desc_count = mod->desc().imports.size();
  if (imports.size() < import_desc_count) {
    *out_trap = Trap::New(store, "not enough imports!");
    return {};
  }

  // Imports.
  for (size_t i = 0; i < import_desc_count; ++i) {
    auto&& import_desc = mod->desc().imports[i];
    Ref extern_ref = imports[i];
    if (extern_ref == Ref::Null) {
      *out_trap = Trap::New(store, StringPrintf("invalid import \"%s.%s\"",
                                                import_desc.type.module.c_str(),
                                                import_desc.type.name.c_str()));
      return {};
    }

    Extern::Ptr extern_{store, extern_ref};
    if (Failed(extern_->Match(store, import_desc.type, out_trap))) {
      return {};
    }

    inst->imports_.push_back(extern_ref);

    switch (import_desc.type.type->kind) {
      case ExternKind::Func:   inst->funcs_.push_back(extern_ref); break;
      case ExternKind::Table:  inst->tables_.push_back(extern_ref); break;
      case ExternKind::Memory: inst->memories_.push_back(extern_ref); break;
      case ExternKind::Global: inst->globals_.push_back(extern_ref); break;
      case ExternKind::Event:  inst->events_.push_back(extern_ref); break;
    }
  }

  // Funcs.
  for (auto&& desc : mod->desc().funcs) {
    inst->funcs_.push_back(DefinedFunc::New(store, inst.ref(), desc).ref());
  }

  // Tables.
  for (auto&& desc : mod->desc().tables) {
    inst->tables_.push_back(Table::New(store, desc.type).ref());
  }

  // Memories.
  for (auto&& desc : mod->desc().memories) {
    inst->memories_.push_back(Memory::New(store, desc.type).ref());
  }

  // Globals.
  for (auto&& desc : mod->desc().globals) {
    inst->globals_.push_back(
        Global::New(store, desc.type, inst->ResolveInitExpr(store, desc.init))
            .ref());
  }

  // Events.
  for (auto&& desc : mod->desc().events) {
    inst->events_.push_back(Event::New(store, desc.type).ref());
  }

  // Exports.
  for (auto&& desc : mod->desc().exports){
    Ref ref;
    switch (desc.type.type->kind) {
      case ExternKind::Func:   ref = inst->funcs_[desc.index]; break;
      case ExternKind::Table:  ref = inst->tables_[desc.index]; break;
      case ExternKind::Memory: ref = inst->memories_[desc.index]; break;
      case ExternKind::Global: ref = inst->globals_[desc.index]; break;
      case ExternKind::Event:  ref = inst->events_[desc.index]; break;
    }
    inst->exports_.push_back(ref);
  }

  // Elems.
  for (auto&& desc : mod->desc().elems) {
    inst->elems_.emplace_back(&desc, inst);
  }

  // Datas.
  for (auto&& desc : mod->desc().datas) {
    inst->datas_.emplace_back(&desc);
  }

  // Initialization.
  enum Pass { Check, Init };
  int pass = store.features().bulk_memory_enabled() ? Init : Check;
  for (; pass <= Init; ++pass) {
    // Elems.
    for (auto&& segment : inst->elems_) {
      auto&& desc = segment.desc();
      if (desc.mode == SegmentMode::Active) {
        Result result;
        Table::Ptr table{store, inst->tables_[desc.table_index]};
        u32 offset = inst->ResolveInitExpr(store, desc.offset).Get<u32>();
        if (pass == Check) {
          result = table->IsValidRange(offset, segment.size()) ? Result::Ok
                                                               : Result::Error;
        } else {
          result = table->Init(store, offset, segment, 0, segment.size());
          segment.Drop();
        }

        if (Failed(result)) {
          *out_trap = Trap::New(
              store, StringPrintf(
                         "out of bounds table access: elem segment is "
                         "out of bounds: [%u, %" PRIu64 ") >= max value %u",
                         offset, u64{offset} + segment.size(), table->size()));
          return {};
        }
      } else if (desc.mode == SegmentMode::Declared) {
        segment.Drop();
      }
    }

    // Data.
    for (auto&& segment : inst->datas_) {
      auto&& desc = segment.desc();
      if (desc.mode == SegmentMode::Active) {
        Result result;
        Memory::Ptr memory{store, inst->memories_[desc.memory_index]};
        u32 offset = inst->ResolveInitExpr(store, desc.offset).Get<u32>();
        if (pass == Check) {
          result = memory->IsValidAccess(offset, 0, segment.size())
                       ? Result::Ok
                       : Result::Error;
        } else {
          result = memory->Init(offset, segment, 0, segment.size());
          segment.Drop();
        }

        if (Failed(result)) {
          *out_trap = Trap::New(
              store,
              StringPrintf("out of bounds memory access: data segment is "
                           "out of bounds: [%u, %" PRIu64 ") >= max value %u",
                           offset, u64{offset} + segment.size(),
                           memory->ByteSize()));
          return {};
        }
      } else if (desc.mode == SegmentMode::Declared) {
        segment.Drop();
      }
    }
  }

  // Start.
  for (auto&& start : mod->desc().starts) {
    Func::Ptr func{store, inst->funcs_[start.func_index]};
    Values results;
    if (Failed(func->Call(store, {}, results, out_trap))) {
      return {};
    }
  }

  return inst;
}